

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_kernel_timer.cpp
# Opt level: O1

void KokkosTools::KernelTimer::kokkosp_finalize_library(void)

{
  long lVar1;
  __time_t __first;
  __suseconds_t __last;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *__name;
  FILE *__s;
  _Rb_tree_node_base *p_Var5;
  ulong uVar6;
  char *pcVar7;
  _Self __tmp;
  bool bVar8;
  double dVar9;
  double dVar10;
  double totalExecuteTime;
  char currentwd [256];
  double local_158;
  double local_148;
  char *local_140;
  timeval local_138;
  KernelPerformanceInfo **local_128;
  
  bVar8 = false;
  gettimeofday(&local_138,(__timezone_ptr_t)0x0);
  dVar9 = (double)local_138.tv_sec;
  dVar10 = (double)local_138.tv_usec;
  pcVar4 = getenv("KOKKOS_TOOLS_TIMER_JSON");
  if (pcVar4 != (char *)0x0) {
    iVar2 = strcmp(pcVar4,"1");
    bVar8 = true;
    if ((iVar2 != 0) && (iVar2 = strcmp(pcVar4,"true"), iVar2 != 0)) {
      iVar2 = strcmp(pcVar4,"True");
      bVar8 = iVar2 == 0;
    }
  }
  __name = (char *)malloc(0x100);
  gethostname(__name,0x100);
  pcVar4 = (char *)malloc(0x100);
  uVar3 = getpid();
  pcVar7 = "dat";
  if (bVar8) {
    pcVar7 = "json";
  }
  snprintf(pcVar4,0x100,"%s-%d.%s",__name,(ulong)uVar3,pcVar7);
  free(__name);
  __s = fopen(pcVar4,"wb");
  local_148 = (dVar10 * 1e-06 + dVar9) - initTime;
  if (bVar8) {
    local_138.tv_sec = 0;
    local_138.tv_usec = 0;
    local_128 = (KernelPerformanceInfo **)0x0;
    if (count_map_abi_cxx11_._24_8_ == 0x10a288) {
      local_158 = 0.0;
    }
    else {
      local_158 = 0.0;
      p_Var5 = (_Rb_tree_node_base *)count_map_abi_cxx11_._24_8_;
      do {
        if ((KernelPerformanceInfo **)local_138.tv_usec == local_128) {
          std::
          vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>
          ::_M_realloc_insert<KokkosTools::KernelTimer::KernelPerformanceInfo*const&>
                    ((vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>
                      *)&local_138,(iterator)local_138.tv_usec,
                     (KernelPerformanceInfo **)(p_Var5 + 2));
        }
        else {
          *(KernelPerformanceInfo **)local_138.tv_usec = *(KernelPerformanceInfo **)(p_Var5 + 2);
          local_138.tv_usec = local_138.tv_usec + 8;
        }
        local_158 = local_158 + *(double *)(*(long *)(p_Var5 + 2) + 0x28);
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != (_Rb_tree_node_base *)(count_map_abi_cxx11_ + 8));
    }
    __last = local_138.tv_usec;
    __first = local_138.tv_sec;
    local_140 = pcVar4;
    if (local_138.tv_sec != local_138.tv_usec) {
      uVar6 = local_138.tv_usec - local_138.tv_sec >> 3;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo**,std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(KokkosTools::KernelTimer::KernelPerformanceInfo*,KokkosTools::KernelTimer::KernelPerformanceInfo*)>>
                ((__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  )local_138.tv_sec,
                 (__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  )local_138.tv_usec,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(KokkosTools::KernelTimer::KernelPerformanceInfo_*,_KokkosTools::KernelTimer::KernelPerformanceInfo_*)>
                  )compareKernelPerformanceInfo);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo**,std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(KokkosTools::KernelTimer::KernelPerformanceInfo*,KokkosTools::KernelTimer::KernelPerformanceInfo*)>>
                ((__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  )__first,
                 (__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  )__last,(_Iter_comp_iter<bool_(*)(KokkosTools::KernelTimer::KernelPerformanceInfo_*,_KokkosTools::KernelTimer::KernelPerformanceInfo_*)>
                           )compareKernelPerformanceInfo);
    }
    fwrite("{\n\"kokkos-kernel-data\" : {\n",0x1b,1,__s);
    dVar9 = local_148;
    fprintf(__s,"    \"total-app-time\"         : %10.3f,\n");
    fprintf(__s,"    \"total-kernel-times\"     : %10.3f,\n",local_158);
    fprintf(__s,"    \"total-non-kernel-times\" : %10.3f,\n",dVar9 - local_158);
    fprintf(__s,"    \"percent-in-kernels\"     : %6.2f,\n",(local_158 / dVar9) * 100.0);
    fprintf(__s,"    \"unique-kernel-calls\"    : %22llu,\n",count_map_abi_cxx11_._40_8_);
    fputc(10,__s);
    fwrite("    \"region-perf-info\"       : [\n",0x21,1,__s);
    if (count_map_abi_cxx11_._24_8_ != 0x10a288) {
      bVar8 = false;
      p_Var5 = (_Rb_tree_node_base *)count_map_abi_cxx11_._24_8_;
      do {
        if (*(int *)(*(long *)(p_Var5 + 2) + 0x40) == 3) {
          if (bVar8) {
            fwrite(",\n",2,1,__s);
          }
          bVar8 = true;
          KernelPerformanceInfo::writeToJSONFile
                    (*(KernelPerformanceInfo **)(p_Var5 + 2),(FILE *)__s,"       ");
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != (_Rb_tree_node_base *)(count_map_abi_cxx11_ + 8));
    }
    fputc(10,__s);
    fwrite("    ],\n",7,1,__s);
    fwrite("    \"kernel-perf-info\"       : [\n",0x21,1,__s);
    if (count_map_abi_cxx11_._24_8_ != 0x10a288) {
      bVar8 = false;
      p_Var5 = (_Rb_tree_node_base *)count_map_abi_cxx11_._24_8_;
      do {
        if (*(int *)(*(long *)(p_Var5 + 2) + 0x40) != 3) {
          if (bVar8) {
            fwrite(",\n",2,1,__s);
          }
          bVar8 = true;
          KernelPerformanceInfo::writeToJSONFile
                    (*(KernelPerformanceInfo **)(p_Var5 + 2),(FILE *)__s,"       ");
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != (_Rb_tree_node_base *)(count_map_abi_cxx11_ + 8));
    }
    fputc(10,__s);
    fwrite("    ]\n",6,1,__s);
    fwrite("}\n}",3,1,__s);
    pcVar4 = local_140;
    if ((KernelPerformanceInfo **)local_138.tv_sec != (KernelPerformanceInfo **)0x0) {
      operator_delete((void *)local_138.tv_sec,(long)local_128 - local_138.tv_sec);
      pcVar4 = local_140;
    }
  }
  else {
    fwrite(&local_148,8,1,__s);
    p_Var5 = (_Rb_tree_node_base *)count_map_abi_cxx11_._24_8_;
    if (count_map_abi_cxx11_._24_8_ != 0x10a288) {
      do {
        KernelPerformanceInfo::writeToBinaryFile
                  (*(KernelPerformanceInfo **)(p_Var5 + 2),(FILE *)__s);
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != (_Rb_tree_node_base *)(count_map_abi_cxx11_ + 8));
    }
  }
  fclose(__s);
  getcwd((char *)&local_138,0x100);
  printf("KokkosP: Kernel timing written to %s/%s \n",&local_138,pcVar4);
  return;
}

Assistant:

void kokkosp_finalize_library() {
  double finishTime = seconds();

  const char* kokkos_tools_timer_json_raw = getenv("KOKKOS_TOOLS_TIMER_JSON");
  const bool kokkos_tools_timer_json =
      kokkos_tools_timer_json_raw == NULL
          ? false
          : strcmp(kokkos_tools_timer_json_raw, "1") == 0 ||
                strcmp(kokkos_tools_timer_json_raw, "true") == 0 ||
                strcmp(kokkos_tools_timer_json_raw, "True") == 0;

  double kernelTimes = 0;

  char* hostname = (char*)malloc(sizeof(char) * 256);
  gethostname(hostname, 256);

  char* fileOutput = (char*)malloc(sizeof(char) * 256);
  snprintf(fileOutput, 256, "%s-%d.%s", hostname, (int)getpid(),
           kokkos_tools_timer_json ? "json" : "dat");

  free(hostname);
  FILE* output_data = fopen(fileOutput, "wb");

  const double totalExecuteTime = (finishTime - initTime);
  if (!kokkos_tools_timer_json) {
    fwrite(&totalExecuteTime, sizeof(totalExecuteTime), 1, output_data);

    for (auto kernel_itr = count_map.begin(); kernel_itr != count_map.end();
         kernel_itr++) {
      kernel_itr->second->writeToBinaryFile(output_data);
    }
  } else {
    std::vector<KernelPerformanceInfo*> kernelList;

    for (auto kernel_itr = count_map.begin(); kernel_itr != count_map.end();
         kernel_itr++) {
      kernelList.push_back(kernel_itr->second);
      kernelTimes += kernel_itr->second->getTime();
    }

    std::sort(kernelList.begin(), kernelList.end(),
              compareKernelPerformanceInfo);

    fprintf(output_data, "{\n\"kokkos-kernel-data\" : {\n");
    fprintf(output_data, "    \"total-app-time\"         : %10.3f,\n",
            totalExecuteTime);
    fprintf(output_data, "    \"total-kernel-times\"     : %10.3f,\n",
            kernelTimes);
    fprintf(output_data, "    \"total-non-kernel-times\" : %10.3f,\n",
            (totalExecuteTime - kernelTimes));

    const double percentKokkos = (kernelTimes / totalExecuteTime) * 100.0;
    fprintf(output_data, "    \"percent-in-kernels\"     : %6.2f,\n",
            percentKokkos);
    fprintf(output_data, "    \"unique-kernel-calls\"    : %22llu,\n",
            (unsigned long long)count_map.size());
    fprintf(output_data, "\n");

    fprintf(output_data, "    \"region-perf-info\"       : [\n");

#define KERNEL_INFO_INDENT "       "

    bool print_comma = false;
    for (auto const& kernel : count_map) {
      if (!is_region(*std::get<1>(kernel))) continue;
      if (print_comma) fprintf(output_data, ",\n");
      kernel.second->writeToJSONFile(output_data, KERNEL_INFO_INDENT);
      print_comma = true;
    }

    fprintf(output_data, "\n");
    fprintf(output_data, "    ],\n");

    fprintf(output_data, "    \"kernel-perf-info\"       : [\n");

    print_comma = false;
    for (auto const& kernel : count_map) {
      if (is_region(*std::get<1>(kernel))) continue;
      if (print_comma) fprintf(output_data, ",\n");
      kernel.second->writeToJSONFile(output_data, KERNEL_INFO_INDENT);
      print_comma = true;
    }

    fprintf(output_data, "\n");
    fprintf(output_data, "    ]\n");

    fprintf(output_data, "}\n}");
  }

  fclose(output_data);

  char currentwd[256];
  getcwd(currentwd, 256);
  printf("KokkosP: Kernel timing written to %s/%s \n", currentwd, fileOutput);

  /*printf("\n");
  printf("======================================================================\n");
  printf("KokkosP: Finalization of Profiling Library\n");
  printf("KokkosP: Executed a total of %llu kernels\n", uniqID);

  std::vector<KernelPerformanceInfo*> kernelList;

  for(auto kernel_itr = count_map.begin(); kernel_itr != count_map.end();
  kernel_itr++) { kernelList.push_back(kernel_itr->second); kernelTimes +=
  kernel_itr->second->getTime();
  }

  std::sort(kernelList.begin(), kernelList.end(), compareKernelPerformanceInfo);
  const double totalExecuteTime = (finishTime - initTime);

  if(0 == strcmp(outputDelimiter, " ")) {
          printf("KokkosP: %100s %14s %14s %6s %6s %14s %4s\n", "Kernel",
  "Calls", "s/Total", "\%/Ko", "\%/Tot", "s/Call", "Type"); } else {
          printf("KokkosP: %s%s%s%s%s%s%s%s%s%s%s%s%s\n",
                  "Kernel",
                  outputDelimiter,
                  "Calls",
                  outputDelimiter,
                  "s/Total",
                  outputDelimiter,
                  "\%/Ko",
                  outputDelimiter,
                  "\%/Tot",
                  outputDelimiter,
                  "s/Call",
                  outputDelimiter,
                  "Type");
  }

  for(auto kernel_itr = kernelList.begin(); kernel_itr != kernelList.end();
  kernel_itr++) { KernelPerformanceInfo* kernelInfo = *kernel_itr;

          const uint64_t kCallCount = kernelInfo->getCallCount();
          const double   kTime      = kernelInfo->getTime();
          const double   kTimeMean  = kTime / (double) kCallCount;

          const std::string& kName   = kernelInfo->getName();
          char* kType = const_cast<char*>("");

          switch(kernelInfo->getKernelType()) {
          case PARALLEL_FOR:
                  kType = const_cast<char*>("PFOR"); break;
          case PARALLEL_SCAN:
                  kType = const_cast<char*>("SCAN"); break;
          case PARALLEL_REDUCE:
                  kType = const_cast<char*>("RDCE"); break;
          case REGION
                  kType = const_cast<char*>("REGI"); break;
          }

          int demangleStatus;
          char* finalDemangle = abi::__cxa_demangle(kName.c_str(), 0, 0,
  &demangleStatus);

          if(0 == strcmp(outputDelimiter, " ")) {
                  printf("KokkosP:
  %s%s%14llu%s%14.5f%s%6.2f%s%6.2f%s%14.5f%s%4s\n", (0 == demangleStatus) ?
  finalDemangle : kName.c_str(), outputDelimiter, kCallCount, outputDelimiter,
                          kTime,
                          outputDelimiter,
                          (kTime / kernelTimes) * 100.0,
                          outputDelimiter,
                          (kTime / totalExecuteTime) * 100.0,
                          outputDelimiter,
                          kTimeMean,
                          outputDelimiter,
                          kType
                          );
          } else {
                  printf("KokkosP: %s%s%llu%s%f%s%f%s%f%s%f%s%s\n",
                          (0 == demangleStatus) ? finalDemangle : kName.c_str(),
                          outputDelimiter,
                          kCallCount,
                          outputDelimiter,
                          kTime,
                          outputDelimiter,
                          (kTime / kernelTimes) * 100.0,
                          outputDelimiter,
                          (kTime / totalExecuteTime) * 100.0,
                          outputDelimiter,
                          kTimeMean,
                          outputDelimiter,
                          kType
                          );
          }
  }

  printf("\n");
  printf("KokkosP: Total Execution Time:        %15.6f seconds.\n",
  totalExecuteTime); printf("KokkosP: Time in Kokkos Kernels:      %15.6f
  seconds.\n", kernelTimes); printf("KokkosP: Time spent outside Kokkos: %15.6f
  seconds.\n", (totalExecuteTime - kernelTimes));

  const double percentKokkos = (kernelTimes / totalExecuteTime) * 100.0;
  printf("KokkosP: Runtime in Kokkos Kernels:   %15.6f \%\n", percentKokkos);
  printf("KokkosP: Unique kernels:              %22llu \n", (uint64_t)
  count_map.size()); printf("KokkosP: Parallel For Calls:          %22llu \n",
  uniqID);

  printf("\n");
  printf("======================================================================\n");
  printf("\n");

  if(NULL != outputDelimiter) {
          free(outputDelimiter);
  }*/
}